

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadTest.cpp
# Opt level: O0

void ReadFilesIntoMemory(void)

{
  InFileInfo *pIVar1;
  XMLCh *pXVar2;
  FILE *__stream;
  size_t sVar3;
  char *pcVar4;
  size_t sVar5;
  long lVar6;
  InFileInfo *fInfo;
  size_t t;
  FILE *fileF;
  int fileNum;
  
  if (gRunInfo.inMemory) {
    for (fileF._4_4_ = 0; fileF._4_4_ < gRunInfo.numInputFiles; fileF._4_4_ = fileF._4_4_ + 1) {
      lVar6 = (long)fileF._4_4_;
      pIVar1 = gRunInfo.files + lVar6;
      pXVar2 = (XMLCh *)xercesc_4_0::XMLString::transcode
                                  (pIVar1->fileName,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      gRunInfo.files[lVar6].uFileName = pXVar2;
      __stream = fopen64(pIVar1->fileName,"rb");
      if (__stream == (FILE *)0x0) {
        fprintf(_stderr,"Can not open file \"%s\".\n",pIVar1->fileName);
        clearFileInfoMemory();
        exit(-1);
      }
      fseek(__stream,0,2);
      sVar3 = ftell(__stream);
      gRunInfo.files[lVar6].fileSize = sVar3;
      fseek(__stream,0,0);
      pcVar4 = (char *)operator_new__(gRunInfo.files[lVar6].fileSize + 1);
      gRunInfo.files[lVar6].fileContent = pcVar4;
      sVar5 = fread(gRunInfo.files[lVar6].fileContent,1,gRunInfo.files[lVar6].fileSize,__stream);
      if (sVar5 != gRunInfo.files[lVar6].fileSize) {
        fprintf(_stderr,"Error reading file \"%s\".\n",pIVar1->fileName);
        clearFileInfoMemory();
        exit(-1);
      }
      fclose(__stream);
      gRunInfo.files[lVar6].fileContent[gRunInfo.files[lVar6].fileSize] = '\0';
    }
  }
  return;
}

Assistant:

void ReadFilesIntoMemory()
{
    int     fileNum;
    FILE    *fileF;
    size_t  t;

    if (gRunInfo.inMemory)
    {
        for (fileNum = 0; fileNum <gRunInfo.numInputFiles; fileNum++)
        {
            InFileInfo *fInfo = &gRunInfo.files[fileNum];
            fInfo->uFileName = XMLString::transcode(fInfo->fileName);
            fileF = fopen( fInfo->fileName, "rb" );
            if (fileF == 0) {
                fprintf(stderr, "Can not open file \"%s\".\n", fInfo->fileName);
                clearFileInfoMemory();
                exit(-1);
            }
            fseek(fileF, 0, SEEK_END);
            fInfo->fileSize = ftell(fileF);
            fseek(fileF, 0, SEEK_SET);
            fInfo->fileContent = new char[fInfo->fileSize + 1];
            t = fread(fInfo->fileContent, 1, fInfo->fileSize, fileF);
            if (t != fInfo->fileSize) {
                fprintf(stderr, "Error reading file \"%s\".\n", fInfo->fileName);
                clearFileInfoMemory();
                exit(-1);
            }
            fclose(fileF);
            fInfo->fileContent[fInfo->fileSize] = 0;
        }
    }
}